

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O2

void TCLAP::ClearContainer<std::__cxx11::list<TCLAP::Visitor*,std::allocator<TCLAP::Visitor*>>>
               (list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_> *c)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)c;
  while (p_Var1 = (((_List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)c) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 8))();
    }
  }
  std::__cxx11::list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>::clear(c);
  return;
}

Assistant:

void ClearContainer(C &c)
{
	typedef typename C::value_type value_type;
	std::for_each(c.begin(), c.end(), DelPtr<value_type>);
	c.clear();
}